

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int server_handle_certificate(ptls_t *tls,ptls_iovec_t message)

{
  ptls_key_schedule_t *in_RDX;
  uint8_t *in_RSI;
  size_t in_RDI;
  int ret;
  int got_certs;
  int *in_stack_00000208;
  uint8_t *in_stack_00000210;
  uint8_t *in_stack_00000218;
  ptls_t *in_stack_00000220;
  undefined4 local_24;
  undefined4 local_4;
  
  local_4 = handle_certificate(in_stack_00000220,in_stack_00000218,in_stack_00000210,
                               in_stack_00000208);
  if (local_4 == 0) {
    if (local_24 == 0) {
      local_4 = 0x74;
    }
    else {
      ptls__key_schedule_update_hash(in_RDX,in_RSI,in_RDI);
      *(undefined4 *)(in_RDI + 8) = 0xb;
      local_4 = 0x202;
    }
  }
  return local_4;
}

Assistant:

static int server_handle_certificate(ptls_t *tls, ptls_iovec_t message)
{
    int got_certs, ret;

    if ((ret = handle_certificate(tls, message.base + PTLS_HANDSHAKE_HEADER_SIZE, message.base + message.len, &got_certs)) != 0)
        return ret;
    if (!got_certs)
        return PTLS_ALERT_CERTIFICATE_REQUIRED;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY;
    return PTLS_ERROR_IN_PROGRESS;
}